

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O3

xr_reader * __thiscall xray_re::xr_file_system::r_open(xr_file_system *this,char *path)

{
  _Alloc_hider _Var1;
  ulong __size;
  void *__ptr;
  FILE *__stream;
  size_t sVar2;
  xr_reader *this_00;
  char cVar3;
  CPath p;
  path local_48;
  char *local_20;
  
  local_20 = path;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_48,&local_20,auto_format);
  _Var1._M_p = local_48._M_pathname._M_dataplus._M_p;
  do {
    cVar3 = *_Var1._M_p;
    if (cVar3 == '\\') {
      *_Var1._M_p = '/';
      cVar3 = '/';
    }
    _Var1._M_p = _Var1._M_p + 1;
  } while (cVar3 != '\0');
  __size = std::filesystem::file_size(&local_48);
  if (__size >> 0x20 == 0) {
    __ptr = malloc(__size);
    if (__ptr != (void *)0x0) {
      __stream = fopen(local_48._M_pathname._M_dataplus._M_p,"r");
      if (__stream != (FILE *)0x0) {
        sVar2 = fread(__ptr,1,__size,__stream);
        if (sVar2 == __size) {
          this_00 = (xr_reader *)operator_new(0x28);
          xr_reader::xr_reader(this_00,__ptr,__size);
          this_00->_vptr_xr_reader = (_func_int **)&PTR__xr_temp_reader_0024a940;
          goto LAB_0019728a;
        }
      }
      free(__ptr);
    }
  }
  this_00 = (xr_reader *)0x0;
LAB_0019728a:
  std::filesystem::__cxx11::path::~path(&local_48);
  return this_00;
}

Assistant:

xr_reader* xr_file_system::r_open(const char* path) const
{
using namespace std;

CPath p(path);
xr_reader* r = nullptr;
uint8_t* data;
uintmax_t len;

	p.make_preferred();
	len = fs::file_size(p);
	if(len > numeric_limits<uint32_t>::max())
		return nullptr;

	data = (uint8_t*)malloc(len);
	if(data != nullptr)
	{
		FILE* infile = fopen(p.c_str(), "r");

		if((infile != nullptr) && (fread(data, 1, len, infile) == len))
			r = new xr_temp_reader(data, len);
		else
			free(data);
	}

	return r;
}